

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void libyuv::StoreAR30(uint8_t *rgb_buf,int b,int g,int r)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint *in_RDI;
  uint32_t ar30;
  
  uVar1 = Clamp10(0);
  uVar2 = Clamp10(0);
  uVar3 = Clamp10(0);
  *in_RDI = uVar1 | uVar2 << 10 | uVar3 << 0x14 | 0xc0000000;
  return;
}

Assistant:

static void StoreAR30(uint8_t* rgb_buf, int b, int g, int r) {
  uint32_t ar30;
  b = b >> 4;  // convert 10.6 to 10 bit.
  g = g >> 4;
  r = r >> 4;
  b = Clamp10(b);
  g = Clamp10(g);
  r = Clamp10(r);
  ar30 = b | ((uint32_t)g << 10) | ((uint32_t)r << 20) | 0xc0000000;
  (*(uint32_t*)rgb_buf) = ar30;
}